

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall Annotator_assignVariableId_Test::TestBody(Annotator_assignVariableId_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_110 [8];
  Message local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b0 [8];
  Message local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  undefined1 local_60 [8];
  VariablePtr variable;
  undefined1 local_40 [8];
  ModelPtr model;
  ParserPtr parser;
  AnnotatorPtr annotator;
  Annotator_assignVariableId_Test *this_local;
  
  libcellml::Annotator::create();
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_40);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_40);
  libcellml::ComponentEntity::component((ulong)&gtest_ar.message_);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Component::variable((ulong)local_60);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)&gtest_ar.message_);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Annotator::setModel((shared_ptr *)peVar2);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_60);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_80,"\"\"","variable->id()",(char (*) [1])0x19fc0a,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x504,pcVar3);
    testing::internal::AssertHelper::operator=(local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_60);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_e0,"\"b4da55\"","variable->id()",(char (*) [7])"b4da55",
             &local_100);
  std::__cxx11::string::~string((string *)&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x507,pcVar3);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_60);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, assignVariableId)
{
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);

    auto variable = model->component(2)->variable(0);

    annotator->setModel(model);

    EXPECT_EQ("", variable->id());

    annotator->assignId(variable);
    EXPECT_EQ("b4da55", variable->id());
}